

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O0

void __thiscall MT32Emu::Part::setPan(Part *this,uint midiPan)

{
  uint midiPan_local;
  Part *this_local;
  
  if ((*(ushort *)this->synth->controlROMFeatures >> 4 & 1) == 0) {
    this->patchTemp->panpot = (Bit8u)((ulong)(midiPan << 3) / 0x44);
  }
  else {
    this->patchTemp->panpot = (Bit8u)((ulong)midiPan / 9);
  }
  return;
}

Assistant:

void Part::setPan(unsigned int midiPan) {
	// NOTE: Panning is inverted compared to GM.

	if (synth->controlROMFeatures->quirkPanMult) {
		// MT-32: Divide by 9
		patchTemp->panpot = Bit8u(midiPan / 9);
	} else {
		// CM-32L: Divide by 8.5
		patchTemp->panpot = Bit8u((midiPan << 3) / 68);
	}

	//synth->printDebug("%s (%s): Set pan to %d", name, currentInstr, panpot);
}